

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void set_sgb_attr(Emulator *e,u8 byte)

{
  if ((byte & 0x3f) < 0x2d) {
    memcpy((e->state).sgb.attr_map,(e->state).sgb.attr_ram + (ulong)(byte & 0x3f) * 0x5a,0x5a);
  }
  if ((byte & 0x40) == 0) {
    return;
  }
  (e->state).sgb.mask = SGB_MASK_CANCEL;
  update_sgb_mask(e);
  return;
}

Assistant:

static void set_sgb_attr(Emulator* e, u8 byte) {
  u8 file = byte & 0x3f;
  if (file < 0x2D) {
    memcpy(SGB.attr_map, SGB.attr_ram + file * 90, sizeof(SGB.attr_map));
  }
  if (byte & 0x40) {
    SGB.mask = SGB_MASK_CANCEL;
    update_sgb_mask(e);
  }
}